

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint unfilter(uchar *out,uchar *in,uint w,uint h,uint bpp)

{
  uint uVar1;
  ulong length;
  long lVar2;
  uint error;
  uchar filterType;
  size_t inindex;
  size_t outindex;
  size_t linebytes;
  size_t bytewidth;
  uchar *prevline;
  uint y;
  uint bpp_local;
  uint h_local;
  uint w_local;
  uchar *in_local;
  uchar *out_local;
  
  bytewidth = 0;
  length = (ulong)(w * bpp + 7 >> 3);
  prevline._0_4_ = 0;
  while( true ) {
    if (h <= (uint)prevline) {
      return 0;
    }
    lVar2 = (length + 1) * (ulong)(uint)prevline;
    uVar1 = unfilterScanline(out + length * (uint)prevline,in + lVar2 + 1,(uchar *)bytewidth,
                             (ulong)(bpp + 7 >> 3),in[lVar2],length);
    if (uVar1 != 0) break;
    bytewidth = (size_t)(out + length * (uint)prevline);
    prevline._0_4_ = (uint)prevline + 1;
  }
  return uVar1;
}

Assistant:

static unsigned unfilter(unsigned char* out, const unsigned char* in, unsigned w, unsigned h, unsigned bpp)
{
  /*
  For PNG filter method 0
  this function unfilters a single image (e.g. without interlacing this is called once, with Adam7 seven times)
  out must have enough bytes allocated already, in must have the scanlines + 1 filtertype byte per scanline
  w and h are image dimensions or dimensions of reduced image, bpp is bits per pixel
  in and out are allowed to be the same memory address (but aren't the same size since in has the extra filter bytes)
  */

  unsigned y;
  unsigned char* prevline = 0;

  /*bytewidth is used for filtering, is 1 when bpp < 8, number of bytes per pixel otherwise*/
  size_t bytewidth = (bpp + 7) / 8;
  size_t linebytes = (w * bpp + 7) / 8;

  for(y = 0; y < h; ++y)
  {
    size_t outindex = linebytes * y;
    size_t inindex = (1 + linebytes) * y; /*the extra filterbyte added to each row*/
    unsigned char filterType = in[inindex];

    CERROR_TRY_RETURN(unfilterScanline(&out[outindex], &in[inindex + 1], prevline, bytewidth, filterType, linebytes));

    prevline = &out[outindex];
  }

  return 0;
}